

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mmu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_433923::NesMmuTest_read_write_byte_to_ppu_Test::
~NesMmuTest_read_write_byte_to_ppu_Test(NesMmuTest_read_write_byte_to_ppu_Test *this)

{
  NesMmuTest::~NesMmuTest(&this->super_NesMmuTest);
  operator_delete(this,0x4c8);
  return;
}

Assistant:

TEST_F(NesMmuTest, read_write_byte_to_ppu) {
    const uint8_t byte = 0xAB;

    EXPECT_CALL(ppu, write_byte(0x2000, 0xAB));
    EXPECT_CALL(ppu, read_byte(0x2000)).WillOnce(testing::Return(0xAB));
    EXPECT_CALL(ppu, write_byte(0x3000, 0xAB));
    EXPECT_CALL(ppu, read_byte(0x3000)).WillOnce(testing::Return(0xAB));

    mmu->write_byte(0x2000, byte);
    EXPECT_EQ(byte, mmu->read_byte(0x2000));
    mmu->write_byte(0x3000, byte);
    EXPECT_EQ(byte, mmu->read_byte(0x3000));
}